

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O2

int fsg_model_free(fsg_model_t *fsg)

{
  int iVar1;
  int iVar2;
  hash_iter_t *itor;
  hash_table_t *phVar3;
  long lVar4;
  
  if (fsg != (fsg_model_t *)0x0) {
    iVar1 = fsg->refcount;
    iVar2 = iVar1 + -1;
    fsg->refcount = iVar2;
    if (iVar1 < 2) {
      for (lVar4 = 0; lVar4 < fsg->n_word; lVar4 = lVar4 + 1) {
        ckd_free(fsg->vocab[lVar4]);
      }
      for (lVar4 = 0; lVar4 < fsg->n_state; lVar4 = lVar4 + 1) {
        phVar3 = fsg->trans[lVar4].trans;
        if (phVar3 == (hash_table_t *)0x0) {
          phVar3 = (hash_table_t *)0x0;
        }
        else {
          for (itor = hash_table_iter(phVar3); itor != (hash_iter_t *)0x0;
              itor = hash_table_iter_next(itor)) {
            glist_free((glist_t)itor->ent->val);
          }
          phVar3 = fsg->trans[lVar4].trans;
        }
        hash_table_free(phVar3);
        hash_table_free(fsg->trans[lVar4].null_trans);
      }
      ckd_free(fsg->trans);
      ckd_free(fsg->vocab);
      listelem_alloc_free(fsg->link_alloc);
      ckd_free(fsg->silwords);
      ckd_free(fsg->altwords);
      ckd_free(fsg->name);
      ckd_free(fsg);
      iVar2 = 0;
    }
    return iVar2;
  }
  return 0;
}

Assistant:

int
fsg_model_free(fsg_model_t * fsg)
{
    int i;

    if (fsg == NULL)
        return 0;

    if (--fsg->refcount > 0)
        return fsg->refcount;

    for (i = 0; i < fsg->n_word; ++i)
        ckd_free(fsg->vocab[i]);
    for (i = 0; i < fsg->n_state; ++i)
        trans_list_free(fsg, i);
    ckd_free(fsg->trans);
    ckd_free(fsg->vocab);
    listelem_alloc_free(fsg->link_alloc);
    bitvec_free(fsg->silwords);
    bitvec_free(fsg->altwords);
    ckd_free(fsg->name);
    ckd_free(fsg);
    return 0;
}